

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

float32 propagateFloat32NaN(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  if ((a & 0x7fffffff) < 0x7f800001) {
    bVar4 = 2;
    if ((b & 0x7fffffff) < 0x7f800001) {
      bVar7 = false;
      bVar1 = false;
    }
    else {
LAB_00cf5a32:
      bVar5 = (b & 0x7fc00000) == 0x7f800000;
      bVar6 = (b & 0x3fffff) != 0;
      bVar7 = bVar4 == 5;
      bVar1 = !bVar7 || bVar6 && bVar5;
      if ((!bVar6 || !bVar5) && (bVar4 != 5)) goto LAB_00cf5a7d;
LAB_00cf5a75:
      status->float_exception_flags = status->float_exception_flags | 1;
    }
  }
  else {
    bVar7 = (a & 0x7fc00000) == 0x7f800000;
    bVar5 = (a & 0x3fffff) != 0;
    if (0x7f800000 < (b & 0x7fffffff)) {
      bVar4 = (bVar5 && bVar7) | 4;
      goto LAB_00cf5a32;
    }
    bVar1 = false;
    if (bVar5 && bVar7) {
      bVar7 = true;
      bVar4 = 5;
      goto LAB_00cf5a75;
    }
    bVar4 = 4;
LAB_00cf5a7d:
    bVar1 = false;
    bVar7 = false;
  }
  if (status->default_nan_mode != '\0') {
    return 0x7fc00000;
  }
  uVar3 = a * 2;
  uVar2 = b * 2;
  if (bVar4 == 5) {
    bVar5 = bVar1 == true;
    if (bVar1 == true) {
      bVar5 = uVar3 < uVar2 || b <= a && uVar3 <= uVar2;
    }
    if (!bVar5) goto LAB_00cf5ae3;
  }
  else if ((bVar4 == 4) && (bVar1 != true || uVar3 >= uVar2 && (b > a || uVar3 > uVar2))) {
LAB_00cf5ae3:
    uVar3 = a | 0x400000;
    if (!bVar7) {
      uVar3 = a;
    }
    return uVar3;
  }
  uVar3 = b | 0x400000;
  if (bVar1 != true) {
    uVar3 = b;
  }
  return uVar3;
}

Assistant:

static inline int float32_is_any_nan(float32 a)
{
    return ((float32_val(a) & ~(1 << 31)) > 0x7f800000UL);
}